

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

int __thiscall
kj::CapabilityStreamConnectionReceiver::accept
          (CapabilityStreamConnectionReceiver *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  TransformPromiseNodeBase *this_00;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  Own<kj::_::PromiseNode> local_20;
  
  AsyncCapabilityStream::receiveStream((AsyncCapabilityStream *)&local_40);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_40,
             kj::_::
             TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::Own<kj::AsyncCapabilityStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1942:13),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0067aee8;
  local_30.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,kj::Own<kj::AsyncCapabilityStream>,kj::CapabilityStreamConnectionReceiver::accept()::$_0,kj::_::PropagateException>>
        ::instance;
  local_20.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,kj::Own<kj::AsyncCapabilityStream>,kj::CapabilityStreamConnectionReceiver::accept()::$_0,kj::_::PropagateException>>
        ::instance;
  local_30.ptr = (PromiseNode *)0x0;
  (this->super_ConnectionReceiver)._vptr_ConnectionReceiver =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,kj::Own<kj::AsyncCapabilityStream>,kj::CapabilityStreamConnectionReceiver::accept()::$_0,kj::_::PropagateException>>
        ::instance;
  this->inner = (AsyncCapabilityStream *)this_00;
  local_20.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_20);
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose(&local_40);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> CapabilityStreamConnectionReceiver::accept() {
  return inner.receiveStream()
      .then([](Own<AsyncCapabilityStream>&& stream) -> Own<AsyncIoStream> {
    return kj::mv(stream);
  });
}